

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getInfo.cpp
# Opt level: O1

int __thiscall ssllabs::SSLlabs::getInfo(SSLlabs *this,labsInfo_t *info)

{
  char *pcVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar2;
  Type pGVar3;
  Ch *pCVar4;
  ValueIterator pGVar5;
  int iVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Document document;
  string data;
  allocator local_d1;
  Data local_d0;
  undefined1 local_c0 [16];
  Data local_b0 [6];
  Number local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_50.i64 = (int64_t)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_b0[0].s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_d0.n = (Number)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/info","");
  curl_read(this,(string *)&local_d0.s,(string *)&local_50.i);
  if (local_d0.n.i64 != (Number)local_c0) {
    operator_delete((void *)local_d0.n);
  }
  local_d0.n = local_50;
  local_d0.s.str = (Ch *)local_50;
  pGVar2 = rapidjson::
           GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           ::
           ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                     ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                       *)&local_b0[0].s,(GenericStringStream<rapidjson::UTF8<char>_> *)&local_d0.s);
  if ((pGVar2->parseResult_).code_ != kParseErrorNone) {
    iVar6 = -1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"could not parse json document\n",0x1e);
LAB_001089d0:
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)&local_b0[0].s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.i64 != &local_40) {
      operator_delete((void *)local_50);
    }
    return iVar6;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_d0.s,(Ch *)local_b0);
  if (local_b0[0].f.flags == 3) {
    if ((local_d0.n.i64 !=
         (Number)((ulong)(uint)local_b0[0]._0_4_ * 0x20 + (ulong)(uint6)local_b0[0]._8_6_)) &&
       (pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b0[0].s,"engineVersion"),
       (undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x400000000000000) !=
       (undefined1  [16])0x0)) {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&local_b0[0].s,"engineVersion");
      pCVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar3);
      pcVar1 = (char *)(info->EngineVersion)._M_string_length;
      strlen(pCVar4);
      std::__cxx11::string::_M_replace((ulong)info,0,pcVar1,(ulong)pCVar4);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d0.s,(Ch *)local_b0);
    if (local_b0[0].f.flags != 3) goto LAB_00108dc8;
    if ((local_d0.n.i64 !=
         (Number)((ulong)(uint)local_b0[0]._0_4_ * 0x20 + (ulong)(uint6)local_b0[0]._8_6_)) &&
       (pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b0[0].s,"criteriaVersion"),
       (undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x400000000000000) !=
       (undefined1  [16])0x0)) {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&local_b0[0].s,"criteriaVersion");
      pCVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar3);
      pcVar1 = (char *)(info->CriteriaVersion)._M_string_length;
      strlen(pCVar4);
      std::__cxx11::string::_M_replace((ulong)&info->CriteriaVersion,0,pcVar1,(ulong)pCVar4);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d0.s,(Ch *)local_b0);
    if (local_b0[0].f.flags != 3) goto LAB_00108dc8;
    if ((local_d0.n.i64 !=
         (Number)((ulong)(uint)local_b0[0]._0_4_ * 0x20 + (ulong)(uint6)local_b0[0]._8_6_)) &&
       (pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b0[0].s,"clientMaxAssessments"),
       (undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x20000000000000) !=
       (undefined1  [16])0x0)) {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&local_b0[0].s,"clientMaxAssessments");
      if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_00108de7;
      info->MaxAssessments = (pGVar3->data_).s.length;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d0.s,(Ch *)local_b0);
    if (local_b0[0].f.flags == 3) {
      if ((local_d0.n.i64 !=
           (Number)((ulong)(uint)local_b0[0]._0_4_ * 0x20 + (ulong)(uint6)local_b0[0]._8_6_)) &&
         (pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)&local_b0[0].s,"currentAssessments"),
         (undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x20000000000000) !=
         (undefined1  [16])0x0)) {
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b0[0].s,"currentAssessments");
        if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x20000000000000)
            == (undefined1  [16])0x0) {
LAB_00108de7:
          __assert_fail("data_.f.flags & kIntFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                        ,0x719,
                        "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        info->CurrentAssessments = (pGVar3->data_).s.length;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_d0.s,(Ch *)local_b0);
      if (local_b0[0].f.flags == 3) {
        if ((local_d0.n.i64 !=
             (Number)((ulong)(uint)local_b0[0]._0_4_ * 0x20 + (ulong)(uint6)local_b0[0]._8_6_)) &&
           (pGVar3 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)&local_b0[0].s,"newAssessmentCoolOff"),
           (undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x80000000000000)
           != (undefined1  [16])0x0)) {
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)&local_b0[0].s,"newAssessmentCoolOff");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x80000000000000) ==
              (undefined1  [16])0x0) {
            __assert_fail("data_.f.flags & kInt64Flag",
                          "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                          ,0x71b,
                          "int64_t rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt64() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          info->NewAssessmentCoolOff = (int64_t)(pGVar3->data_).n;
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_d0.s,(Ch *)local_b0);
        if (local_b0[0].f.flags == 3) {
          iVar6 = 0;
          if ((local_d0.n.i64 !=
               (Number)((ulong)(uint)local_b0[0]._0_4_ * 0x20 + (ulong)(uint6)local_b0[0]._8_6_)) &&
             (pGVar3 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>
                                 ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   *)&local_b0[0].s,"messages"), (pGVar3->data_).f.flags == 4)) {
            pGVar3 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)&local_b0[0].s,"messages");
            if ((pGVar3->data_).f.flags == 4) {
              this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)((ulong)(pGVar3->data_).s.str & 0xffffffffffff);
              while (pGVar3 = rapidjson::
                              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ::operator[]<char_const>
                                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                          *)&local_b0[0].s,"messages"), (pGVar3->data_).f.flags == 4
                    ) {
                pGVar5 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ::End(pGVar3);
                if (this_00 == pGVar5) goto LAB_001089d0;
                if ((undefined1  [16])
                    ((undefined1  [16])this_00->data_ & (undefined1  [16])0x400000000000000) !=
                    (undefined1  [16])0x0) {
                  pCVar4 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ::GetString(this_00);
                  std::__cxx11::string::string((string *)&local_d0.s,pCVar4,&local_d1);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &info->Messages,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_d0.s);
                  if (local_d0.n.i64 != (Number)local_c0) {
                    operator_delete((void *)local_d0.n);
                  }
                }
                this_00 = this_00 + 1;
              }
            }
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                          ,0x711,
                          "Array rapidjson::GenericValue<rapidjson::UTF8<>>::GetArray() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          goto LAB_001089d0;
        }
      }
    }
  }
LAB_00108dc8:
  __assert_fail("IsObject()",
                "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                ,0x4f7,
                "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

int SSLlabs::getInfo(labsInfo_t &info) {
        std::string data = {};
        rapidjson::Document document;

        curl_read("/info", data);
        if (document.Parse<0>(data.c_str()).HasParseError()) {
            std::cerr << "could not parse json document\n";
            return -1;
        }

        if (document.HasMember("engineVersion") && document["engineVersion"].IsString()) {
            info.EngineVersion.assign(document["engineVersion"].GetString());
        }

        if (document.HasMember("criteriaVersion") && document["criteriaVersion"].IsString()) {
            info.CriteriaVersion.assign(document["criteriaVersion"].GetString());
        }

        if (document.HasMember("clientMaxAssessments") && document["clientMaxAssessments"].IsInt()) {
            info.MaxAssessments = document["clientMaxAssessments"].GetInt();
        }

        if (document.HasMember("currentAssessments") && document["currentAssessments"].IsInt()) {
            info.CurrentAssessments = document["currentAssessments"].GetInt();
        }

        if (document.HasMember("newAssessmentCoolOff") && document["newAssessmentCoolOff"].IsInt64()) {
            info.NewAssessmentCoolOff = document["newAssessmentCoolOff"].GetInt64();
        }

        if (document.HasMember("messages") && document["messages"].IsArray()) {
            for (auto i = document["messages"].GetArray().Begin(); i != document["messages"].GetArray().End(); i++) {
                if (i->IsString()) {
                    info.Messages.push_back(i->GetString());
                }
            }
        }

        return 0;
    }